

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int __thiscall
google::protobuf::RepeatedField<double>::SpaceUsedExcludingSelf(RepeatedField<double> *this)

{
  int iVar1;
  size_t size;
  
  size = 0;
  if (0 < (long)this->total_size_) {
    size = (long)this->total_size_ * 8 + 8;
  }
  iVar1 = internal::ToIntSize(size);
  return iVar1;
}

Assistant:

inline size_t RepeatedField<Element>::SpaceUsedExcludingSelfLong() const {
  return total_size_ > 0 ? (total_size_ * sizeof(Element) + kRepHeaderSize) : 0;
}